

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O0

void tommy_allocator_done(tommy_allocator *alloc)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_allocator *alloc_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  allocator_reset(alloc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_allocator_done(tommy_allocator* alloc)
{
	allocator_reset(alloc);
}